

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main-batched.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  gpt2_batch batch;
  gpt2_batch batch_00;
  gpt2_batch batch_01;
  ggml_gallocr_t pgVar1;
  id *piVar2;
  gpt2_pos *pgVar3;
  gpt2_seq_id *pgVar4;
  int8_t *piVar5;
  pointer pfVar6;
  bool bVar7;
  int iVar8;
  long lVar9;
  time_t tVar10;
  long lVar11;
  long lVar12;
  undefined8 uVar13;
  ggml_cgraph *pgVar14;
  long lVar15;
  mapped_type *pmVar16;
  int iVar17;
  ulong uVar18;
  uint uVar19;
  int in_R8D;
  uint uVar20;
  ulong uVar21;
  long lVar22;
  long lVar23;
  uint32_t i_1;
  long lVar24;
  int i_2;
  ulong uVar25;
  long lVar26;
  int32_t i;
  int iVar27;
  undefined1 auVar28 [16];
  undefined4 uStack_16e8;
  id id;
  ulong local_16e0;
  allocator_type local_16d1;
  ulong local_16d0;
  uint local_16c4;
  ggml_gallocr_t local_16c0;
  vector<int,_std::allocator<int>_> embd_inp;
  long local_1698;
  vector<int,_std::allocator<int>_> i_batch;
  gpt2_batch local_1648;
  vector<float,_std::allocator<float>_> logits;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  streams;
  gpt_params params;
  undefined1 local_1518 [72];
  pointer local_14d0;
  pointer pgStack_14c8;
  pointer local_14c0;
  ulong local_14a8;
  uint32_t local_14a0;
  pointer local_1498;
  pointer pgStack_1490;
  pointer local_1488;
  ggml_backend_buffer_t local_1480;
  ggml_context *local_1478;
  ggml_backend_t local_1470;
  ggml_backend_buffer_t local_1468;
  _Rb_tree_node_base local_1458;
  size_t local_1438;
  gpt_vocab vocab;
  mt19937 rng;
  
  ggml_time_init();
  lVar9 = ggml_time_us();
  gpt_params::gpt_params(&params);
  bVar7 = gpt_params_parse(argc,argv,&params);
  if (bVar7) {
    if (params.seed < 0) {
      tVar10 = time((time_t *)0x0);
      params.seed = (int32_t)tVar10;
    }
    printf("%s: seed = %d\n","main");
    std::
    mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
    ::seed(&rng,(long)params.seed);
    if (params.prompt._M_string_length == 0) {
      gpt_random_prompt_abi_cxx11_((string *)local_1518,&rng);
      std::__cxx11::string::operator=((string *)&params.prompt,(string *)local_1518);
      std::__cxx11::string::~string((string *)local_1518);
    }
    vocab.token_to_id._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &vocab.token_to_id._M_t._M_impl.super__Rb_tree_header._M_header;
    vocab.token_to_id._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    vocab.token_to_id._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    vocab.token_to_id._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    vocab.id_to_token._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &vocab.id_to_token._M_t._M_impl.super__Rb_tree_header._M_header;
    vocab.id_to_token._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    vocab.id_to_token._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_1458._M_left = &local_1458;
    local_1518._0_8_ = (pointer)0x4000000c451;
    local_1518._8_8_ = 0xc00000300;
    local_1518._16_8_ = 0x10000000c;
    local_1518._24_4_ = 0x3727c5ac;
    local_14c0 = (pointer)0x0;
    local_14d0 = (pointer)0x0;
    pgStack_14c8 = (pointer)0x0;
    local_14a8 = 0;
    local_14a0 = 0;
    vocab.id_to_token._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    vocab.special_tokens.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_1488 = (pointer)0x0;
    local_1498 = (pointer)0x0;
    pgStack_1490 = (pointer)0x0;
    local_1470 = (ggml_backend_t)0x0;
    vocab.special_tokens.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    vocab.special_tokens.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_1458._M_color = _S_red;
    local_1458._M_parent = (_Base_ptr)0x0;
    local_1438 = 0;
    local_1458._M_right = local_1458._M_left;
    vocab.token_to_id._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         vocab.token_to_id._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    vocab.id_to_token._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         vocab.id_to_token._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    lVar11 = ggml_time_us();
    bVar7 = gpt2_model_load(&params.model,(gpt2_model *)local_1518,&vocab,params.n_ctx,in_R8D);
    if (bVar7) {
      lVar12 = ggml_time_us();
      test_gpt_tokenizer(&vocab,&params.token_test);
      gpt_tokenize(&embd_inp,&vocab,&params.prompt);
      local_16e0 = (ulong)params.n_parallel;
      uVar18 = (long)embd_inp.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)embd_inp.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start >> 2;
      if (uVar18 <= local_16e0) {
        uVar18 = local_16e0;
      }
      gpt2_batch_init(&local_1648,(int32_t)uVar18,0);
      uVar13 = ggml_backend_get_default_buffer_type(local_1470);
      local_16c0 = (ggml_gallocr_t)ggml_gallocr_new(uVar13);
      iVar27 = 1;
      local_1648.n_tokens = (int32_t)uVar18;
      pgVar14 = gpt2_graph((gpt2_model *)local_1518,&local_1648,true);
      pgVar1 = local_16c0;
      ggml_gallocr_reserve(local_16c0,pgVar14);
      uVar21 = 0;
      uVar13 = ggml_gallocr_get_buffer_size(pgVar1,0);
      auVar28._8_4_ = (int)((ulong)uVar13 >> 0x20);
      auVar28._0_8_ = uVar13;
      auVar28._12_4_ = 0x45300000;
      fprintf(_stderr,"%s: compute buffer size: %.2f MB\n",
              SUB84(((auVar28._8_8_ - 1.9342813113834067e+25) +
                    ((double)CONCAT44(0x43300000,(int)uVar13) - 4503599627370496.0)) * 0.0009765625
                    * 0.0009765625,0),"main");
      piVar5 = local_1648.logits;
      pgVar4 = local_1648.seq_id;
      pgVar3 = local_1648.pos;
      piVar2 = local_1648.token;
      logits.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      logits.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      logits.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      uVar25 = (ulong)((long)embd_inp.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_finish -
                      (long)embd_inp.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start) >> 2;
      uVar20 = (uint)uVar25;
      uVar18 = 0;
      if (0 < (int)uVar20) {
        uVar18 = uVar25 & 0xffffffff;
      }
      for (; uVar18 != uVar21; uVar21 = uVar21 + 1) {
        local_1648.token[uVar21] =
             embd_inp.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start[uVar21];
        local_1648.pos[uVar21] = (gpt2_pos)uVar21;
        local_1648.seq_id[uVar21] = 0;
        local_1648.logits[uVar21] = '\0';
      }
      local_1648.logits[(long)(int)uVar20 + -1] = '\x01';
      batch._4_4_ = local_1648._4_4_;
      batch.n_tokens = uVar20;
      batch.token = local_1648.token;
      batch.embd = local_1648.embd;
      batch.pos = local_1648.pos;
      batch.seq_id = local_1648.seq_id;
      batch.logits = local_1648.logits;
      local_1648.n_tokens = uVar20;
      iVar8 = gpt2_decode((gpt2_model *)local_1518,local_16c0,batch,params.n_threads,&logits);
      if (iVar8 == 0) {
        uVar19 = 0x7fffffff;
        if (uVar20 < 0x7fffffff) {
          uVar19 = uVar20;
        }
        local_16d0 = uVar25;
        for (iVar27 = 1; uVar18 = local_16e0, iVar8 = (int)local_16e0, iVar27 < (int)local_16e0;
            iVar27 = iVar27 + 1) {
          streams.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start._0_4_ = 0;
          lVar22 = 0;
          i_batch.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start._0_4_ = iVar27;
          for (uVar18 = 0; uVar18 < local_14a8 >> 0x20; uVar18 = uVar18 + 1) {
            bVar7 = gpt2_kv_cell::has_seq_id
                              ((gpt2_kv_cell *)((long)&local_1498->pos + lVar22),
                               (gpt2_seq_id *)&streams);
            if ((bVar7) && (*(uint *)((long)&local_1498->pos + lVar22) < uVar19)) {
              std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
              _M_insert_unique<int_const&>
                        ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *
                         )(&(local_1498->seq_id)._M_t._M_impl.field_0x0 + lVar22),(int *)&i_batch);
            }
            lVar22 = lVar22 + 0x38;
          }
        }
        if (1 < (int)local_16e0) {
          printf("\n\n%s: generating %d sequences ...\n","main",local_16e0 & 0xffffffff);
        }
        iVar27 = local_1518._4_4_ -
                 (int)((ulong)((long)embd_inp.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                     super__Vector_impl_data._M_finish -
                              (long)embd_inp.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                    super__Vector_impl_data._M_start) >> 2);
        if (params.n_predict <= iVar27) {
          iVar27 = params.n_predict;
        }
        params.n_predict = iVar27;
        printf("%s: prompt: \'%s\'\n","main",params.prompt._M_dataplus._M_p);
        printf("%s: number of tokens in prompt = %zu, first 8 tokens: ","main",
               (long)embd_inp.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)embd_inp.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start >> 2);
        lVar22 = 0;
        while( true ) {
          iVar27 = (int)((ulong)((long)embd_inp.super__Vector_base<int,_std::allocator<int>_>.
                                       _M_impl.super__Vector_impl_data._M_finish -
                                (long)embd_inp.super__Vector_base<int,_std::allocator<int>_>._M_impl
                                      .super__Vector_impl_data._M_start) >> 2);
          if (7 < iVar27) {
            iVar27 = 8;
          }
          if (iVar27 <= lVar22) break;
          printf("%d ",(ulong)(uint)embd_inp.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                    super__Vector_impl_data._M_start[lVar22]);
          lVar22 = lVar22 + 1;
        }
        puts("\n");
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::vector(&streams,uVar18,(allocator_type *)&i_batch);
        uVar21 = local_16d0;
        iVar27 = (int)local_16d0;
        id = iVar27 + -1;
        std::vector<int,_std::allocator<int>_>::vector(&i_batch,uVar18,&id,&local_16d1);
        lVar22 = (long)(int)local_1518._0_4_;
        iVar17 = params.n_predict + iVar27;
        iVar27 = params.n_predict + iVar27;
        uVar25 = 0;
        if (0 < iVar8) {
          uVar25 = uVar18 & 0xffffffff;
        }
        local_16c4 = 0;
        lVar23 = 0;
        local_1698 = 0;
        while (iVar8 = (int)uVar18, local_16d0 = uVar21, (int)uVar21 < iVar27) {
          lVar24 = 0;
          uVar20 = 0;
          for (uVar18 = 0;
              pfVar6 = logits.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                       super__Vector_impl_data._M_start, uVar25 != uVar18; uVar18 = uVar18 + 1) {
            lVar26 = (long)*(int *)(CONCAT44(i_batch.super__Vector_base<int,_std::allocator<int>_>.
                                             _M_impl.super__Vector_impl_data._M_start._4_4_,
                                             (int)i_batch.
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl.super__Vector_impl_data._M_start) +
                                   uVar18 * 4);
            if (-1 < lVar26) {
              id = 0;
              lVar15 = ggml_time_us();
              id = gpt_sample_top_k_top_p
                             (&vocab,pfVar6 + lVar26 * lVar22,params.top_k,(double)params.top_p,
                              (double)params.temp,&rng);
              lVar26 = ggml_time_us();
              if (((~params.ignore_eos & id == 0xc450) == 0) && ((int)local_16d0 != iVar17 + -1)) {
                pmVar16 = std::
                          map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          ::operator[](&vocab.id_to_token,&id);
                if ((int)local_16e0 == 1) {
                  printf("%s",(pmVar16->_M_dataplus)._M_p);
                  fflush(_stdout);
                }
                std::__cxx11::string::append
                          ((string *)
                           (CONCAT44(streams.
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                     streams.
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start._0_4_) + lVar24));
                piVar2[(int)uVar20] = id;
                pgVar3[(int)uVar20] = (gpt2_pos)local_16d0;
                pgVar4[(int)uVar20] = (gpt2_seq_id)uVar18;
                piVar5[(int)uVar20] = '\x01';
                *(uint *)(CONCAT44(i_batch.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data._M_start._4_4_,
                                   (int)i_batch.super__Vector_base<int,_std::allocator<int>_>.
                                        _M_impl.super__Vector_impl_data._M_start) + uVar18 * 4) =
                     uVar20;
                uVar20 = uVar20 + 1;
                local_16c4 = local_16c4 + 1;
              }
              else {
                *(undefined4 *)
                 (CONCAT44(i_batch.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_start._4_4_,
                           (int)i_batch.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start) + uVar18 * 4) = 0xffffffff;
                putchar(10);
                if (1 < (int)local_16e0) {
                  printf("%s: stream %d finished at n_cur = %d","main",uVar18 & 0xffffffff,
                         local_16d0);
                }
              }
              local_1698 = (local_1698 - lVar15) + lVar26;
            }
            lVar24 = lVar24 + 0x20;
          }
          local_1648.n_tokens = uVar20;
          if (uVar20 == 0) {
            iVar8 = (int)local_16e0;
            break;
          }
          lVar24 = ggml_time_us();
          uVar18 = local_16e0;
          batch_00._4_4_ = local_1648._4_4_;
          batch_00.n_tokens = local_1648.n_tokens;
          batch_00.token = local_1648.token;
          batch_00.embd = local_1648.embd;
          batch_00.pos = local_1648.pos;
          batch_00.seq_id = local_1648.seq_id;
          batch_00.logits = local_1648.logits;
          uVar20 = gpt2_decode((gpt2_model *)local_1518,local_16c0,batch_00,params.n_threads,&logits
                              );
          if (uVar20 != 0) {
            fprintf(_stderr,"%s : failed to eval, return code %d\n","main",(ulong)uVar20);
            iVar27 = 1;
            goto LAB_0010bd06;
          }
          lVar26 = ggml_time_us();
          lVar23 = (lVar23 - lVar24) + lVar26;
          uVar21 = (ulong)((int)local_16d0 + 1);
        }
        if (1 < iVar8) {
          putchar(10);
          lVar22 = 0;
          for (uVar18 = 0; local_16e0 != uVar18; uVar18 = uVar18 + 1) {
            printf("sequence %d:\n\n%s%s\n\n",uVar18 & 0xffffffff,params.prompt._M_dataplus._M_p,
                   *(undefined8 *)
                    (CONCAT44(streams.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start._4_4_,
                              streams.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start._0_4_) + lVar22));
            lVar22 = lVar22 + 0x20;
          }
        }
        lVar22 = ggml_time_us();
        puts("\n");
        printf("%s:     n_decoded = %8d\n","main",(ulong)local_16c4);
        printf("%s:     load time = %8.2f ms\n",SUB84((double)((float)(lVar12 - lVar11) / 1000.0),0)
               ,"main");
        printf("%s:   sample time = %8.2f ms\n",SUB84((double)((float)local_1698 / 1000.0),0),"main"
              );
        printf("%s:  predict time = %8.2f ms\n",SUB84((double)((float)lVar23 / 1000.0),0),"main");
        printf("%s:    total time = %8.2f ms\n",SUB84((double)((float)(lVar22 - lVar9) / 1000.0),0),
               "main");
        batch_01.token = (id *)local_1648.embd;
        batch_01._0_8_ = local_1648.token;
        batch_01.embd = (float *)local_1648.pos;
        batch_01.pos = local_1648.seq_id;
        batch_01.seq_id = (gpt2_seq_id *)local_1648.logits;
        batch_01.logits._0_4_ = uStack_16e8;
        batch_01.logits._4_4_ = id;
        gpt2_batch_free(batch_01);
        ggml_free(local_1478);
        ggml_gallocr_free(local_16c0);
        ggml_backend_buffer_free(local_1468);
        ggml_backend_buffer_free(local_1480);
        iVar27 = 0;
        ggml_backend_free(local_1470);
LAB_0010bd06:
        std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                  (&i_batch.super__Vector_base<int,_std::allocator<int>_>);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&streams);
      }
      else {
        printf("%s: gpt2_decode() failed\n","main");
      }
      std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
                (&logits.super__Vector_base<float,_std::allocator<float>_>);
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                (&embd_inp.super__Vector_base<int,_std::allocator<int>_>);
    }
    else {
      fprintf(_stderr,"%s: failed to load model from \'%s\'\n","main",params.model._M_dataplus._M_p)
      ;
      iVar27 = 1;
    }
    gpt2_model::~gpt2_model((gpt2_model *)local_1518);
    gpt_vocab::~gpt_vocab(&vocab);
  }
  else {
    iVar27 = 1;
  }
  gpt_params::~gpt_params(&params);
  return iVar27;
}

Assistant:

int main(int argc, char ** argv) {
    ggml_time_init();

    const int64_t t_main_start_us = ggml_time_us();

    gpt_params params;

    if (gpt_params_parse(argc, argv, params) == false) {
        return 1;
    }

    if (params.seed < 0) {
        params.seed = time(NULL);
    }

    printf("%s: seed = %d\n", __func__, params.seed);

    std::mt19937 rng(params.seed);
    if (params.prompt.empty()) {
        params.prompt = gpt_random_prompt(rng);
    }

    int64_t t_load_us = 0;

    gpt_vocab vocab;
    gpt2_model model;

    // load the model
    {
        const int64_t t_start_us = ggml_time_us();

        if (!gpt2_model_load(params.model, model, vocab, params.n_ctx, params.n_gpu_layers)) {
            fprintf(stderr, "%s: failed to load model from '%s'\n", __func__, params.model.c_str());
            return 1;
        }

        t_load_us = ggml_time_us() - t_start_us;

        test_gpt_tokenizer(vocab, params.token_test);
    }

    // tokenize the prompt
    std::vector<gpt_vocab::id> embd_inp = ::gpt_tokenize(vocab, params.prompt);

    const int n_parallel = params.n_parallel;
    const int n_batch_max = std::max(embd_inp.size(), (size_t)n_parallel);

    // create a gpt2_batch
    // we use this object to submit token data for decoding
    gpt2_batch batch = gpt2_batch_init(n_batch_max, 0);

    // prepare required memory and allocate the compute buffer
    ggml_gallocr_t allocr = NULL;
    {
        // create an allocator to measure the memory usage
        allocr = ggml_gallocr_new(ggml_backend_get_default_buffer_type(model.backend));

        // create the worst case graph for memory usage estimation
        batch.n_tokens = n_batch_max;
        struct ggml_cgraph * gf = gpt2_graph(model, batch, true);

        // pre-allocate the compute buffer for the worst case (optional)
        ggml_gallocr_reserve(allocr, gf);
        size_t mem_size = ggml_gallocr_get_buffer_size(allocr, 0);
        fprintf(stderr, "%s: compute buffer size: %.2f MB\n", __func__, mem_size/1024.0/1024.0);
    }

    int64_t t_sample_us  = 0;
    int64_t t_predict_us = 0;

    std::vector<float> logits;

    // evaluate the initial prompt
    batch.n_tokens = embd_inp.size();

    for (int32_t i = 0; i < batch.n_tokens; i++) {
        batch.token[i]  = embd_inp[i];
        batch.pos[i]    = i;
        batch.seq_id[i] = 0;
        batch.logits[i] = false;
    }

    // gpt2_decode will output logits only for the last token of the prompt
    batch.logits[batch.n_tokens - 1] = true;

    if (gpt2_decode(model, allocr, batch, params.n_threads, logits) != 0) {
        printf("%s: gpt2_decode() failed\n", __func__);
        return 1;
    }

    // assign the system KV cache to all parallel sequences
    // this way, the parallel sequences will "reuse" the prompt tokens without having to copy them
    for (int32_t i = 1; i < n_parallel; ++i) {
        gpt2_kv_cache_seq_cp(model.kv_cache, 0, i, 0, batch.n_tokens);
    }

    if (n_parallel > 1) {
        printf("\n\n%s: generating %d sequences ...\n", __func__, n_parallel);
    }

    params.n_predict = std::min(params.n_predict, model.hparams.n_ctx - (int) embd_inp.size());

    printf("%s: prompt: '%s'\n", __func__, params.prompt.c_str());
    printf("%s: number of tokens in prompt = %zu, first 8 tokens: ", __func__, embd_inp.size());
    for (int i = 0; i < std::min(8, (int) embd_inp.size()); i++) {
        printf("%d ", embd_inp[i]);
    }
    printf("\n\n");

    std::vector<gpt_vocab::token> streams(n_parallel);

    // remember the batch index of the last token for each parallel sequence
    // we need this to determine which logits to sample from
    std::vector<int32_t> i_batch(n_parallel, batch.n_tokens - 1);

    int n_cur     = batch.n_tokens;
    int n_len     = batch.n_tokens + params.n_predict;
    int n_decoded = 0;

    const int   n_vocab = model.hparams.n_vocab;
    const int   top_k = params.top_k;
    const float top_p = params.top_p;
    const float temp  = params.temp;

    while (n_cur < n_len) {
        batch.n_tokens = 0;

        for (int32_t i = 0; i < n_parallel; ++i) {
            if (i_batch[i] < 0) {
                // the stream has already finished
                continue;
            }

            auto * logits_i = logits.data() + i_batch[i]*n_vocab;

            gpt_vocab::id id = 0;
            {
                const int64_t t_start_sample_us = ggml_time_us();

                id = gpt_sample_top_k_top_p(vocab, logits_i, top_k, top_p, temp, rng);

                t_sample_us += ggml_time_us() - t_start_sample_us;
            }

            // is it an end of stream? -> mark the stream as finished
            if ((!params.ignore_eos && id == 50256) || n_cur == n_len - 1) {
                i_batch[i] = -1;
                printf("\n");
                if (n_parallel > 1) {
                    printf("%s: stream %d finished at n_cur = %d", __func__, i, n_cur);
                }

                continue;
            }

            auto& token = vocab.id_to_token[id];
            if (n_parallel == 1) {
                printf("%s", token.c_str());
                fflush(stdout);
            }

            streams[i] += token;

            // push this new token for next evaluation
            batch.token [batch.n_tokens] = id;
            batch.pos   [batch.n_tokens] = n_cur;
            batch.seq_id[batch.n_tokens] = i;
            batch.logits[batch.n_tokens] = true;

            i_batch[i] = batch.n_tokens;

            batch.n_tokens += 1;

            n_decoded += 1;
        }

        // all streams are finished
        if (batch.n_tokens == 0) {
            break;
        }

        n_cur += 1;

        {
            const int64_t t_start_us = ggml_time_us();

            // evaluate the current batch with the transformer model
            int ret_code = gpt2_decode(model, allocr, batch, params.n_threads, logits);
            if (ret_code != 0) {
                fprintf(stderr, "%s : failed to eval, return code %d\n", __func__, ret_code);
                return 1;
            }

            t_predict_us += ggml_time_us() - t_start_us;
        }
    }

    if (n_parallel > 1) {
        printf("\n");

        for (int32_t i = 0; i < n_parallel; ++i) {
            printf("sequence %d:\n\n%s%s\n\n", i, params.prompt.c_str(), streams[i].c_str());
        }
    }

    // report timing
    {
        const int64_t t_main_end_us = ggml_time_us();

        printf("\n\n");
        printf("%s:     n_decoded = %8d\n",      __func__, n_decoded);
        printf("%s:     load time = %8.2f ms\n", __func__, t_load_us/1000.0f);
        printf("%s:   sample time = %8.2f ms\n", __func__, t_sample_us/1000.0f);
        printf("%s:  predict time = %8.2f ms\n", __func__, t_predict_us/1000.0f);
        printf("%s:    total time = %8.2f ms\n", __func__, (t_main_end_us - t_main_start_us)/1000.0f);
    }

    gpt2_batch_free(batch);
    ggml_free(model.ctx_w);

    ggml_gallocr_free(allocr);
    ggml_backend_buffer_free(model.buffer_w);
    ggml_backend_buffer_free(model.kv_cache.buffer);
    ggml_backend_free(model.backend);

    return 0;
}